

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

int pageant_reencrypt_key(pageant_pubkey *key,char **retstr)

{
  uint uVar1;
  PageantClientOp *pco_00;
  char *pcVar2;
  ptrlen pl;
  uint reply;
  PageantClientOp *pco;
  char **retstr_local;
  pageant_pubkey *key_local;
  
  pco_00 = pageant_client_op_new();
  if (key->ssh_version == 1) {
    pcVar2 = dupstr("Can\'t re-encrypt an SSH-1 key");
    *retstr = pcVar2;
    pageant_client_op_free(pco_00);
    key_local._4_4_ = 1;
  }
  else {
    BinarySink_put_byte(pco_00->binarysink_,'\x1b');
    pl.len = 0x25;
    pl.ptr = "reencrypt@putty.projects.tartarus.org";
    BinarySink_put_stringpl(pco_00->binarysink_,pl);
    BinarySink_put_string(pco_00->binarysink_,key->blob->s,key->blob->len);
    uVar1 = pageant_client_op_query(pco_00);
    pageant_client_op_free(pco_00);
    if (uVar1 == 6) {
      *retstr = (char *)0x0;
      key_local._4_4_ = 0;
    }
    else {
      if (uVar1 == 5) {
        pcVar2 = dupstr("Agent doesn\'t support encrypted keys");
        *retstr = pcVar2;
      }
      else {
        pcVar2 = dupstr("Agent failed to re-encrypt key");
        *retstr = pcVar2;
      }
      key_local._4_4_ = 1;
    }
  }
  return key_local._4_4_;
}

Assistant:

int pageant_reencrypt_key(struct pageant_pubkey *key, char **retstr)
{
    PageantClientOp *pco = pageant_client_op_new();

    if (key->ssh_version == 1) {
        *retstr = dupstr("Can't re-encrypt an SSH-1 key");
        pageant_client_op_free(pco);
        return PAGEANT_ACTION_FAILURE;
    } else {
        put_byte(pco, SSH2_AGENTC_EXTENSION);
        put_stringpl(pco, extension_names[EXT_REENCRYPT]);
        put_string(pco, key->blob->s, key->blob->len);
    }

    unsigned reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);

    if (reply != SSH_AGENT_SUCCESS) {
        if (reply == SSH_AGENT_FAILURE) {
            /* The agent didn't understand the protocol extension at all. */
            *retstr = dupstr("Agent doesn't support encrypted keys");
        } else {
            *retstr = dupstr("Agent failed to re-encrypt key");
        }
        return PAGEANT_ACTION_FAILURE;
    } else {
        *retstr = NULL;
        return PAGEANT_ACTION_OK;
    }
}